

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O0

ssize_t __thiscall
RawFile::pread(RawFile *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  ssize_t sVar1;
  runtime_error *this_00;
  void *pvVar2;
  undefined4 in_register_00000034;
  ssize_t result;
  char *buf_raw;
  void *local_28;
  size_t local_20;
  void *local_18;
  
  pvVar2 = (void *)CONCAT44(in_register_00000034,__fd);
  local_28 = pvVar2;
  local_20 = __nbytes;
  local_18 = __buf;
  while( true ) {
    if (local_18 == (void *)0x0) {
      return (ssize_t)pvVar2;
    }
    sVar1 = ::pread(this->fd,local_28,(size_t)local_18,local_20);
    if (sVar1 < 0) break;
    local_28 = (void *)(sVar1 + (long)local_28);
    local_20 = sVar1 + local_20;
    pvVar2 = (void *)((long)local_18 - sVar1);
    local_18 = pvVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"RawFile::pread: pread failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void RawFile::pread(void *buf, size_t to_read, off_t offset) const {
    auto *buf_raw = static_cast<char *>(buf);
    while (to_read > 0) {
        ssize_t result = ::pread(fd, buf_raw, to_read, offset);
        if (result < 0) {
            throw std::runtime_error("RawFile::pread: pread failed");
        }
        buf_raw += result;
        offset += result;
        to_read -= result;
    }
}